

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::SubGridIntersector1Pluecker<4,_true>_>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong *puVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  float fVar64;
  float fVar65;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar66;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  float fVar95;
  undefined1 auVar94 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_b21;
  RTCIntersectArguments *local_b20;
  RTCRayQueryContext *local_b18;
  Ray *local_b10;
  ulong local_b08;
  ulong local_b00;
  uint local_af4;
  uint local_af0;
  int local_aec;
  Geometry *local_ae8;
  RayQueryContext *local_ae0;
  ulong *local_ad8;
  ulong local_ad0;
  long local_ac8;
  long local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  long local_aa0;
  ulong local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  ulong local_a68;
  float local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  uint local_a44;
  uint local_a40;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 *local_8e0;
  byte local_8d8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  uint uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800 [250];
  undefined1 auVar35 [16];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar95 = ray->tfar;
    if (0.0 <= fVar95) {
      puVar26 = local_800 + 1;
      aVar1 = (ray->dir).field_0;
      auVar38 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar33 = vandps_avx512vl((undefined1  [16])aVar1,auVar33);
      auVar34._8_4_ = 0x219392ef;
      auVar34._0_8_ = 0x219392ef219392ef;
      auVar34._12_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar33,auVar34,1);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar33 = vdivps_avx(auVar86,(undefined1  [16])aVar1);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar7 = (bool)((byte)uVar24 & 1);
      auVar35._0_4_ = (uint)bVar7 * auVar34._0_4_ | (uint)!bVar7 * auVar33._0_4_;
      bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar7 * auVar34._4_4_ | (uint)!bVar7 * auVar33._4_4_;
      bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar7 * auVar34._8_4_ | (uint)!bVar7 * auVar33._8_4_;
      bVar7 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar7 * auVar34._12_4_ | (uint)!bVar7 * auVar33._12_4_;
      auVar36._8_4_ = 0x3f7ffffa;
      auVar36._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar36._12_4_ = 0x3f7ffffa;
      auVar36 = vmulps_avx512vl(auVar35,auVar36);
      auVar37._8_4_ = 0x3f800003;
      auVar37._0_8_ = 0x3f8000033f800003;
      auVar37._12_4_ = 0x3f800003;
      auVar37 = vmulps_avx512vl(auVar35,auVar37);
      auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar103 = ZEXT1664(auVar33);
      auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar104 = ZEXT1664(auVar33);
      auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar105 = ZEXT1664(auVar33);
      bVar7 = auVar36._0_4_ < 0.0;
      auVar33 = vbroadcastss_avx512vl(auVar36);
      auVar106 = ZEXT1664(auVar33);
      auVar33 = vmovshdup_avx(auVar36);
      auVar34 = vshufps_avx512vl(auVar36,auVar36,0x55);
      auVar107 = ZEXT1664(auVar34);
      auVar34 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vshufps_avx512vl(auVar36,auVar36,0xaa);
      auVar108 = ZEXT1664(auVar36);
      fVar65 = auVar37._0_4_;
      local_960 = vshufps_avx(auVar37,auVar37,0x55);
      auVar98 = ZEXT1664(local_960);
      local_970 = vshufps_avx(auVar37,auVar37,0xaa);
      auVar99 = ZEXT1664(local_970);
      uVar24 = (ulong)bVar7 << 4;
      uVar27 = (ulong)(auVar33._0_4_ < 0.0) << 4 | 0x20;
      uVar29 = (ulong)(auVar34._0_4_ < 0.0) << 4 | 0x40;
      uVar30 = uVar24 ^ 0x10;
      uVar31 = uVar27 ^ 0x10;
      uVar80 = auVar38._0_4_;
      local_980._4_4_ = uVar80;
      local_980._0_4_ = uVar80;
      local_980._8_4_ = uVar80;
      local_980._12_4_ = uVar80;
      auVar101 = ZEXT1664(local_980);
      local_990._4_4_ = fVar95;
      local_990._0_4_ = fVar95;
      local_990._8_4_ = fVar95;
      local_990._12_4_ = fVar95;
      auVar102 = ZEXT1664(local_990);
      local_a70 = (ulong)(((uint)bVar7 << 4) >> 2);
      local_a78 = uVar30 >> 2;
      local_a80 = uVar27 >> 2;
      local_a88 = uVar31 >> 2;
      local_a90 = uVar29 >> 2;
      local_a98 = (uVar29 ^ 0x10) >> 2;
      local_ae0 = context;
      local_ab0 = uVar24;
      local_950 = fVar65;
      fStack_94c = fVar65;
      fStack_948 = fVar65;
      fStack_944 = fVar65;
      local_ab8 = uVar27;
      fVar95 = fVar65;
      fVar32 = fVar65;
      fVar64 = fVar65;
      local_b10 = ray;
LAB_01bfb885:
      if (puVar26 != local_800) {
        uVar20 = puVar26[-1];
        puVar26 = puVar26 + -1;
        while ((uVar20 & 8) == 0) {
          auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar24),auVar103._0_16_);
          auVar33 = vmulps_avx512vl(auVar106._0_16_,auVar33);
          auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar27),auVar104._0_16_);
          auVar38 = vmulps_avx512vl(auVar107._0_16_,auVar38);
          auVar33 = vmaxps_avx(auVar33,auVar38);
          auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar29),auVar105._0_16_);
          auVar38 = vmulps_avx512vl(auVar108._0_16_,auVar38);
          auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar30),auVar103._0_16_);
          auVar77._0_4_ = fVar65 * auVar34._0_4_;
          auVar77._4_4_ = fVar95 * auVar34._4_4_;
          auVar77._8_4_ = fVar32 * auVar34._8_4_;
          auVar77._12_4_ = fVar64 * auVar34._12_4_;
          auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar31),auVar104._0_16_);
          auVar81._0_4_ = auVar98._0_4_ * auVar34._0_4_;
          auVar81._4_4_ = auVar98._4_4_ * auVar34._4_4_;
          auVar81._8_4_ = auVar98._8_4_ * auVar34._8_4_;
          auVar81._12_4_ = auVar98._12_4_ * auVar34._12_4_;
          auVar34 = vminps_avx(auVar77,auVar81);
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + (uVar29 ^ 0x10)),
                                    auVar105._0_16_);
          auVar82._0_4_ = auVar99._0_4_ * auVar36._0_4_;
          auVar82._4_4_ = auVar99._4_4_ * auVar36._4_4_;
          auVar82._8_4_ = auVar99._8_4_ * auVar36._8_4_;
          auVar82._12_4_ = auVar99._12_4_ * auVar36._12_4_;
          auVar38 = vmaxps_avx(auVar38,auVar101._0_16_);
          auVar33 = vmaxps_avx(auVar33,auVar38);
          auVar38 = vminps_avx(auVar82,auVar102._0_16_);
          auVar38 = vminps_avx(auVar34,auVar38);
          uVar22 = vcmpps_avx512vl(auVar33,auVar38,2);
          if ((char)uVar22 == '\0') goto LAB_01bfb885;
          uVar18 = uVar20 & 0xfffffffffffffff0;
          lVar19 = 0;
          for (uVar20 = uVar22; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar20 = *(ulong *)(uVar18 + lVar19 * 8);
          uVar21 = (uint)uVar22 - 1 & (uint)uVar22;
          uVar22 = (ulong)uVar21;
          if (uVar21 != 0) {
            do {
              *puVar26 = uVar20;
              puVar26 = puVar26 + 1;
              lVar19 = 0;
              for (uVar20 = uVar22; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                lVar19 = lVar19 + 1;
              }
              uVar22 = uVar22 - 1 & uVar22;
              uVar20 = *(ulong *)(uVar18 + lVar19 * 8);
            } while (uVar22 != 0);
          }
        }
        uVar22 = uVar20 & 0xfffffffffffffff0;
        local_ad8 = puVar26;
        local_ac8 = (ulong)((uint)uVar20 & 0xf) - 8;
        for (local_ac0 = 0; local_ac0 != local_ac8; local_ac0 = local_ac0 + 1) {
          lVar19 = local_ac0 * 0x58;
          local_aa0 = uVar22 + lVar19;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(uVar22 + 0x20 + lVar19);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(uVar22 + 0x24 + lVar19);
          uVar11 = vpcmpub_avx512vl(auVar38,auVar73,2);
          uVar80 = *(undefined4 *)(uVar22 + 0x38 + lVar19);
          auVar70._4_4_ = uVar80;
          auVar70._0_4_ = uVar80;
          auVar70._8_4_ = uVar80;
          auVar70._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(uVar22 + 0x44 + lVar19);
          auVar74._4_4_ = uVar80;
          auVar74._0_4_ = uVar80;
          auVar74._8_4_ = uVar80;
          auVar74._12_4_ = uVar80;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(ulong *)(local_a70 + 0x20 + local_aa0);
          auVar33 = vpmovzxbd_avx(auVar78);
          auVar33 = vcvtdq2ps_avx(auVar33);
          auVar38 = vfmadd213ps_fma(auVar33,auVar74,auVar70);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = *(ulong *)(local_a78 + 0x20 + local_aa0);
          auVar33 = vpmovzxbd_avx(auVar83);
          auVar33 = vcvtdq2ps_avx(auVar33);
          auVar34 = vfmadd213ps_fma(auVar33,auVar74,auVar70);
          uVar80 = *(undefined4 *)(uVar22 + 0x3c + lVar19);
          auVar71._4_4_ = uVar80;
          auVar71._0_4_ = uVar80;
          auVar71._8_4_ = uVar80;
          auVar71._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(uVar22 + 0x48 + lVar19);
          auVar75._4_4_ = uVar80;
          auVar75._0_4_ = uVar80;
          auVar75._8_4_ = uVar80;
          auVar75._12_4_ = uVar80;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)(local_a80 + 0x20 + local_aa0);
          auVar33 = vpmovzxbd_avx(auVar87);
          auVar33 = vcvtdq2ps_avx(auVar33);
          auVar36 = vfmadd213ps_fma(auVar33,auVar75,auVar71);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *(ulong *)(local_a88 + 0x20 + local_aa0);
          auVar33 = vpmovzxbd_avx(auVar90);
          auVar33 = vcvtdq2ps_avx(auVar33);
          auVar37 = vfmadd213ps_fma(auVar33,auVar75,auVar71);
          uVar80 = *(undefined4 *)(uVar22 + 0x40 + lVar19);
          auVar72._4_4_ = uVar80;
          auVar72._0_4_ = uVar80;
          auVar72._8_4_ = uVar80;
          auVar72._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(uVar22 + 0x4c + lVar19);
          auVar76._4_4_ = uVar80;
          auVar76._0_4_ = uVar80;
          auVar76._8_4_ = uVar80;
          auVar76._12_4_ = uVar80;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)(local_a90 + 0x20 + local_aa0);
          auVar33 = vpmovzxbd_avx(auVar91);
          auVar33 = vcvtdq2ps_avx(auVar33);
          auVar35 = vfmadd213ps_fma(auVar33,auVar76,auVar72);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(local_a98 + 0x20 + local_aa0);
          auVar33 = vpmovzxbd_avx(auVar93);
          auVar33 = vcvtdq2ps_avx(auVar33);
          auVar86 = vfmadd213ps_fma(auVar33,auVar76,auVar72);
          auVar33 = vsubps_avx512vl(auVar38,auVar103._0_16_);
          auVar33 = vmulps_avx512vl(auVar106._0_16_,auVar33);
          auVar38 = vsubps_avx512vl(auVar36,auVar104._0_16_);
          auVar38 = vmulps_avx512vl(auVar107._0_16_,auVar38);
          auVar33 = vmaxps_avx(auVar33,auVar38);
          auVar38 = vsubps_avx512vl(auVar35,auVar105._0_16_);
          auVar38 = vmulps_avx512vl(auVar108._0_16_,auVar38);
          auVar34 = vsubps_avx512vl(auVar34,auVar103._0_16_);
          auVar79._0_4_ = fVar65 * auVar34._0_4_;
          auVar79._4_4_ = fVar95 * auVar34._4_4_;
          auVar79._8_4_ = fVar32 * auVar34._8_4_;
          auVar79._12_4_ = fVar64 * auVar34._12_4_;
          auVar34 = vsubps_avx512vl(auVar37,auVar104._0_16_);
          auVar84._0_4_ = auVar98._0_4_ * auVar34._0_4_;
          auVar84._4_4_ = auVar98._4_4_ * auVar34._4_4_;
          auVar84._8_4_ = auVar98._8_4_ * auVar34._8_4_;
          auVar84._12_4_ = auVar98._12_4_ * auVar34._12_4_;
          auVar34 = vminps_avx(auVar79,auVar84);
          auVar36 = vsubps_avx512vl(auVar86,auVar105._0_16_);
          auVar85._0_4_ = auVar99._0_4_ * auVar36._0_4_;
          auVar85._4_4_ = auVar99._4_4_ * auVar36._4_4_;
          auVar85._8_4_ = auVar99._8_4_ * auVar36._8_4_;
          auVar85._12_4_ = auVar99._12_4_ * auVar36._12_4_;
          auVar38 = vmaxps_avx(auVar38,auVar101._0_16_);
          auVar33 = vmaxps_avx(auVar33,auVar38);
          auVar38 = vminps_avx(auVar85,auVar102._0_16_);
          auVar38 = vminps_avx(auVar34,auVar38);
          uVar9 = vcmpps_avx512vl(auVar33,auVar38,2);
          uVar20 = CONCAT44((int)(local_a98 >> 0x20),(uint)(byte)((byte)uVar11 & (byte)uVar9));
          while (uVar20 != 0) {
            local_a68 = uVar20;
            lVar19 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              lVar19 = lVar19 + 1;
            }
            uVar2 = *(ushort *)(local_aa0 + lVar19 * 8);
            uVar3 = *(ushort *)(local_aa0 + 2 + lVar19 * 8);
            local_ad0 = (ulong)*(uint *)(local_aa0 + 0x50);
            local_aa8 = (ulong)*(uint *)(local_aa0 + 4 + lVar19 * 8);
            pGVar4 = (context->scene->geometries).items[local_ad0].ptr;
            lVar19 = *(long *)&pGVar4->field_0x58;
            lVar28 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     local_aa8;
            local_af0 = uVar2 & 0x7fff;
            local_af4 = uVar3 & 0x7fff;
            uVar21 = *(uint *)(lVar19 + 4 + lVar28);
            uVar20 = (ulong)uVar21;
            uVar27 = (ulong)(uVar21 * local_af4 + *(int *)(lVar19 + lVar28) + local_af0);
            lVar5 = *(long *)&pGVar4[1].time_range.upper;
            p_Var6 = pGVar4[1].intersectionFilterN;
            auVar33 = *(undefined1 (*) [16])(lVar5 + (uVar27 + 1) * (long)p_Var6);
            auVar38 = *(undefined1 (*) [16])(lVar5 + (uVar27 + uVar20) * (long)p_Var6);
            lVar23 = uVar27 + uVar20 + 1;
            auVar34 = *(undefined1 (*) [16])(lVar5 + lVar23 * (long)p_Var6);
            uVar24 = (ulong)(-1 < (short)uVar2);
            auVar36 = *(undefined1 (*) [16])(lVar5 + (uVar27 + uVar24 + 1) * (long)p_Var6);
            lVar25 = uVar24 + lVar23;
            auVar37 = *(undefined1 (*) [16])(lVar5 + lVar25 * (long)p_Var6);
            uVar24 = 0;
            if (-1 < (short)uVar3) {
              uVar24 = uVar20;
            }
            auVar35 = *(undefined1 (*) [16])(lVar5 + (uVar27 + uVar20 + uVar24) * (long)p_Var6);
            auVar86 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar24) * (long)p_Var6);
            auVar48._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar24 + lVar25) * (long)p_Var6);
            auVar48._0_16_ = auVar34;
            auVar81 = vunpcklps_avx(auVar33,auVar37);
            auVar77 = vunpckhps_avx(auVar33,auVar37);
            auVar82 = vunpcklps_avx(auVar36,auVar34);
            auVar36 = vunpckhps_avx(auVar36,auVar34);
            auVar70 = vunpcklps_avx(auVar77,auVar36);
            auVar71 = vunpcklps_avx(auVar81,auVar82);
            auVar36 = vunpckhps_avx(auVar81,auVar82);
            auVar81 = vunpcklps_avx(auVar38,auVar86);
            auVar77 = vunpckhps_avx(auVar38,auVar86);
            auVar82 = vunpcklps_avx(auVar34,auVar35);
            auVar35 = vunpckhps_avx(auVar34,auVar35);
            auVar77 = vunpcklps_avx(auVar77,auVar35);
            auVar72 = vunpcklps_avx(auVar81,auVar82);
            auVar35 = vunpckhps_avx(auVar81,auVar82);
            auVar45._16_16_ = auVar86;
            auVar45._0_16_ = auVar38;
            auVar43._16_16_ = auVar37;
            auVar43._0_16_ = auVar33;
            auVar63 = vunpcklps_avx(auVar43,auVar45);
            auVar40._16_16_ = auVar34;
            auVar40._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * uVar27);
            auVar62 = vunpcklps_avx(auVar40,auVar48);
            auVar59 = vunpcklps_avx(auVar62,auVar63);
            auVar62 = vunpckhps_avx(auVar62,auVar63);
            auVar63 = vunpckhps_avx(auVar43,auVar45);
            auVar58 = vunpckhps_avx(auVar40,auVar48);
            auVar58 = vunpcklps_avx(auVar58,auVar63);
            auVar44._16_16_ = auVar71;
            auVar44._0_16_ = auVar71;
            auVar46._16_16_ = auVar36;
            auVar46._0_16_ = auVar36;
            auVar47._16_16_ = auVar70;
            auVar47._0_16_ = auVar70;
            auVar49._16_16_ = auVar72;
            auVar49._0_16_ = auVar72;
            auVar51._16_16_ = auVar35;
            auVar51._0_16_ = auVar35;
            uVar80 = *(undefined4 *)&(local_b10->org).field_0;
            auVar52._4_4_ = uVar80;
            auVar52._0_4_ = uVar80;
            auVar52._8_4_ = uVar80;
            auVar52._12_4_ = uVar80;
            auVar52._16_4_ = uVar80;
            auVar52._20_4_ = uVar80;
            auVar52._24_4_ = uVar80;
            auVar52._28_4_ = uVar80;
            uVar80 = *(undefined4 *)((long)&(local_b10->org).field_0 + 4);
            auVar53._4_4_ = uVar80;
            auVar53._0_4_ = uVar80;
            auVar53._8_4_ = uVar80;
            auVar53._12_4_ = uVar80;
            auVar53._16_4_ = uVar80;
            auVar53._20_4_ = uVar80;
            auVar53._24_4_ = uVar80;
            auVar53._28_4_ = uVar80;
            auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(local_b10->org).field_0.m128[2]));
            uVar80 = *(undefined4 *)&(local_b10->dir).field_0;
            auVar92._4_4_ = uVar80;
            auVar92._0_4_ = uVar80;
            auVar92._8_4_ = uVar80;
            auVar92._12_4_ = uVar80;
            auVar92._16_4_ = uVar80;
            auVar92._20_4_ = uVar80;
            auVar92._24_4_ = uVar80;
            auVar92._28_4_ = uVar80;
            auVar50._16_16_ = auVar77;
            auVar50._0_16_ = auVar77;
            uVar80 = *(undefined4 *)((long)&(local_b10->dir).field_0 + 4);
            auVar96._4_4_ = uVar80;
            auVar96._0_4_ = uVar80;
            auVar96._8_4_ = uVar80;
            auVar96._12_4_ = uVar80;
            auVar96._16_4_ = uVar80;
            auVar96._20_4_ = uVar80;
            auVar96._24_4_ = uVar80;
            auVar96._28_4_ = uVar80;
            fVar95 = (local_b10->dir).field_0.m128[2];
            auVar100._4_4_ = fVar95;
            auVar100._0_4_ = fVar95;
            auVar100._8_4_ = fVar95;
            auVar100._12_4_ = fVar95;
            auVar100._16_4_ = fVar95;
            auVar100._20_4_ = fVar95;
            auVar100._24_4_ = fVar95;
            auVar100._28_4_ = fVar95;
            auVar63 = vsubps_avx(auVar59,auVar52);
            auVar62 = vsubps_avx(auVar62,auVar53);
            auVar40 = vsubps_avx512vl(auVar58,auVar39);
            auVar58 = vsubps_avx(auVar44,auVar52);
            auVar59 = vsubps_avx(auVar46,auVar53);
            auVar41 = vsubps_avx512vl(auVar47,auVar39);
            auVar42 = vsubps_avx512vl(auVar49,auVar52);
            auVar43 = vsubps_avx512vl(auVar51,auVar53);
            auVar44 = vsubps_avx512vl(auVar50,auVar39);
            auVar45 = vsubps_avx512vl(auVar42,auVar63);
            auVar46 = vsubps_avx512vl(auVar43,auVar62);
            auVar47 = vsubps_avx512vl(auVar44,auVar40);
            auVar48 = vsubps_avx512vl(auVar63,auVar58);
            auVar49 = vsubps_avx512vl(auVar62,auVar59);
            auVar50 = vsubps_avx512vl(auVar40,auVar41);
            auVar51 = vsubps_avx512vl(auVar58,auVar42);
            auVar52 = vsubps_avx512vl(auVar59,auVar43);
            auVar53 = vsubps_avx512vl(auVar41,auVar44);
            auVar54 = vaddps_avx512vl(auVar42,auVar63);
            auVar55 = vaddps_avx512vl(auVar43,auVar62);
            auVar39 = vaddps_avx512vl(auVar44,auVar40);
            auVar56 = vmulps_avx512vl(auVar55,auVar47);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar46,auVar39);
            auVar39 = vmulps_avx512vl(auVar39,auVar45);
            auVar57 = vfmsub231ps_avx512vl(auVar39,auVar47,auVar54);
            auVar39._4_4_ = auVar54._4_4_ * auVar46._4_4_;
            auVar39._0_4_ = auVar54._0_4_ * auVar46._0_4_;
            auVar39._8_4_ = auVar54._8_4_ * auVar46._8_4_;
            auVar39._12_4_ = auVar54._12_4_ * auVar46._12_4_;
            auVar39._16_4_ = auVar54._16_4_ * auVar46._16_4_;
            auVar39._20_4_ = auVar54._20_4_ * auVar46._20_4_;
            auVar39._24_4_ = auVar54._24_4_ * auVar46._24_4_;
            auVar39._28_4_ = auVar54._28_4_;
            auVar33 = vfmsub231ps_fma(auVar39,auVar45,auVar55);
            auVar55._0_4_ = fVar95 * auVar33._0_4_;
            auVar55._4_4_ = fVar95 * auVar33._4_4_;
            auVar55._8_4_ = fVar95 * auVar33._8_4_;
            auVar55._12_4_ = fVar95 * auVar33._12_4_;
            auVar55._16_4_ = fVar95 * 0.0;
            auVar55._20_4_ = fVar95 * 0.0;
            auVar55._24_4_ = fVar95 * 0.0;
            auVar55._28_4_ = 0;
            auVar39 = vfmadd231ps_avx512vl(auVar55,auVar96,auVar57);
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar92,auVar56);
            auVar57._0_4_ = auVar63._0_4_ + auVar58._0_4_;
            auVar57._4_4_ = auVar63._4_4_ + auVar58._4_4_;
            auVar57._8_4_ = auVar63._8_4_ + auVar58._8_4_;
            auVar57._12_4_ = auVar63._12_4_ + auVar58._12_4_;
            auVar57._16_4_ = auVar63._16_4_ + auVar58._16_4_;
            auVar57._20_4_ = auVar63._20_4_ + auVar58._20_4_;
            auVar57._24_4_ = auVar63._24_4_ + auVar58._24_4_;
            auVar57._28_4_ = auVar63._28_4_ + auVar58._28_4_;
            auVar54 = vaddps_avx512vl(auVar62,auVar59);
            auVar55 = vaddps_avx512vl(auVar40,auVar41);
            auVar56 = vmulps_avx512vl(auVar54,auVar50);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar49,auVar55);
            auVar55 = vmulps_avx512vl(auVar55,auVar48);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar57);
            auVar57 = vmulps_avx512vl(auVar57,auVar49);
            auVar57 = vfmsub231ps_avx512vl(auVar57,auVar48,auVar54);
            auVar54._4_4_ = fVar95 * auVar57._4_4_;
            auVar54._0_4_ = fVar95 * auVar57._0_4_;
            auVar54._8_4_ = fVar95 * auVar57._8_4_;
            auVar54._12_4_ = fVar95 * auVar57._12_4_;
            auVar54._16_4_ = fVar95 * auVar57._16_4_;
            auVar54._20_4_ = fVar95 * auVar57._20_4_;
            auVar54._24_4_ = fVar95 * auVar57._24_4_;
            auVar54._28_4_ = auVar57._28_4_;
            auVar54 = vfmadd231ps_avx512vl(auVar54,auVar96,auVar55);
            auVar54 = vfmadd231ps_avx512vl(auVar54,auVar92,auVar56);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar58 = vaddps_avx512vl(auVar58,auVar42);
            auVar59 = vaddps_avx512vl(auVar59,auVar43);
            auVar41 = vaddps_avx512vl(auVar41,auVar44);
            auVar42 = vmulps_avx512vl(auVar59,auVar53);
            auVar42 = vfmsub231ps_avx512vl(auVar42,auVar52,auVar41);
            auVar41 = vmulps_avx512vl(auVar41,auVar51);
            auVar43 = vfmsub231ps_avx512vl(auVar41,auVar53,auVar58);
            auVar41._4_4_ = auVar58._4_4_ * auVar52._4_4_;
            auVar41._0_4_ = auVar58._0_4_ * auVar52._0_4_;
            auVar41._8_4_ = auVar58._8_4_ * auVar52._8_4_;
            auVar41._12_4_ = auVar58._12_4_ * auVar52._12_4_;
            auVar41._16_4_ = auVar58._16_4_ * auVar52._16_4_;
            auVar41._20_4_ = auVar58._20_4_ * auVar52._20_4_;
            auVar41._24_4_ = auVar58._24_4_ * auVar52._24_4_;
            auVar41._28_4_ = auVar58._28_4_;
            auVar33 = vfmsub231ps_fma(auVar41,auVar51,auVar59);
            auVar58 = vmulps_avx512vl(auVar100,ZEXT1632(auVar33));
            auVar58 = vfmadd231ps_avx512vl(auVar58,auVar96,auVar43);
            auVar41 = vfmadd231ps_avx512vl(auVar58,auVar92,auVar42);
            auVar42._0_4_ = auVar39._0_4_ + auVar54._0_4_;
            auVar42._4_4_ = auVar39._4_4_ + auVar54._4_4_;
            auVar42._8_4_ = auVar39._8_4_ + auVar54._8_4_;
            auVar42._12_4_ = auVar39._12_4_ + auVar54._12_4_;
            auVar42._16_4_ = auVar39._16_4_ + auVar54._16_4_;
            auVar42._20_4_ = auVar39._20_4_ + auVar54._20_4_;
            auVar42._24_4_ = auVar39._24_4_ + auVar54._24_4_;
            auVar42._28_4_ = auVar39._28_4_ + auVar54._28_4_;
            local_900 = vaddps_avx512vl(auVar41,auVar42);
            vandps_avx512vl(local_900,auVar55);
            auVar58._8_4_ = 0x34000000;
            auVar58._0_8_ = 0x3400000034000000;
            auVar58._12_4_ = 0x34000000;
            auVar58._16_4_ = 0x34000000;
            auVar58._20_4_ = 0x34000000;
            auVar58._24_4_ = 0x34000000;
            auVar58._28_4_ = 0x34000000;
            auVar58 = vmulps_avx512vl(local_900,auVar58);
            auVar59 = vminps_avx512vl(auVar39,auVar54);
            auVar42 = vminps_avx512vl(auVar59,auVar41);
            auVar59._8_4_ = 0x80000000;
            auVar59._0_8_ = 0x8000000080000000;
            auVar59._12_4_ = 0x80000000;
            auVar59._16_4_ = 0x80000000;
            auVar59._20_4_ = 0x80000000;
            auVar59._24_4_ = 0x80000000;
            auVar59._28_4_ = 0x80000000;
            auVar59 = vxorps_avx512vl(auVar58,auVar59);
            uVar9 = vcmpps_avx512vl(auVar42,auVar59,5);
            auVar59 = vmaxps_avx512vl(auVar39,auVar54);
            auVar59 = vmaxps_avx512vl(auVar59,auVar41);
            uVar11 = vcmpps_avx512vl(auVar59,auVar58,2);
            local_8d8 = (byte)uVar9 | (byte)uVar11;
            if (local_8d8 != 0) {
              auVar58 = vmulps_avx512vl(auVar47,auVar49);
              auVar59 = vmulps_avx512vl(auVar45,auVar50);
              auVar41 = vmulps_avx512vl(auVar46,auVar48);
              auVar42 = vmulps_avx512vl(auVar50,auVar52);
              auVar43 = vmulps_avx512vl(auVar48,auVar53);
              auVar44 = vmulps_avx512vl(auVar49,auVar51);
              auVar46 = vfmsub213ps_avx512vl(auVar46,auVar50,auVar58);
              auVar47 = vfmsub213ps_avx512vl(auVar47,auVar48,auVar59);
              auVar45 = vfmsub213ps_avx512vl(auVar45,auVar49,auVar41);
              auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar42);
              auVar50 = vfmsub213ps_avx512vl(auVar51,auVar50,auVar43);
              auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar44);
              vandps_avx512vl(auVar58,auVar55);
              vandps_avx512vl(auVar42,auVar55);
              uVar24 = vcmpps_avx512vl(auVar48,auVar48,1);
              vandps_avx512vl(auVar59,auVar55);
              vandps_avx512vl(auVar43,auVar55);
              uVar27 = vcmpps_avx512vl(auVar48,auVar48,1);
              vandps_avx512vl(auVar41,auVar55);
              vandps_avx512vl(auVar44,auVar55);
              uVar20 = vcmpps_avx512vl(auVar48,auVar48,1);
              bVar7 = (bool)((byte)uVar24 & 1);
              auVar60._0_4_ = (float)((uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * auVar49._0_4_);
              bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
              auVar60._4_4_ = (float)((uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * auVar49._4_4_);
              bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
              auVar60._8_4_ = (float)((uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * auVar49._8_4_);
              bVar7 = (bool)((byte)(uVar24 >> 3) & 1);
              auVar60._12_4_ = (float)((uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * auVar49._12_4_)
              ;
              bVar7 = (bool)((byte)(uVar24 >> 4) & 1);
              auVar60._16_4_ = (float)((uint)bVar7 * auVar46._16_4_ | (uint)!bVar7 * auVar49._16_4_)
              ;
              bVar7 = (bool)((byte)(uVar24 >> 5) & 1);
              auVar60._20_4_ = (float)((uint)bVar7 * auVar46._20_4_ | (uint)!bVar7 * auVar49._20_4_)
              ;
              bVar7 = (bool)((byte)(uVar24 >> 6) & 1);
              auVar60._24_4_ = (float)((uint)bVar7 * auVar46._24_4_ | (uint)!bVar7 * auVar49._24_4_)
              ;
              bVar7 = SUB81(uVar24 >> 7,0);
              auVar60._28_4_ = (uint)bVar7 * auVar46._28_4_ | (uint)!bVar7 * auVar49._28_4_;
              bVar7 = (bool)((byte)uVar27 & 1);
              auVar61._0_4_ = (float)((uint)bVar7 * auVar47._0_4_ | (uint)!bVar7 * auVar50._0_4_);
              bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
              auVar61._4_4_ = (float)((uint)bVar7 * auVar47._4_4_ | (uint)!bVar7 * auVar50._4_4_);
              bVar7 = (bool)((byte)(uVar27 >> 2) & 1);
              auVar61._8_4_ = (float)((uint)bVar7 * auVar47._8_4_ | (uint)!bVar7 * auVar50._8_4_);
              bVar7 = (bool)((byte)(uVar27 >> 3) & 1);
              auVar61._12_4_ = (float)((uint)bVar7 * auVar47._12_4_ | (uint)!bVar7 * auVar50._12_4_)
              ;
              bVar7 = (bool)((byte)(uVar27 >> 4) & 1);
              auVar61._16_4_ = (float)((uint)bVar7 * auVar47._16_4_ | (uint)!bVar7 * auVar50._16_4_)
              ;
              bVar7 = (bool)((byte)(uVar27 >> 5) & 1);
              auVar61._20_4_ = (float)((uint)bVar7 * auVar47._20_4_ | (uint)!bVar7 * auVar50._20_4_)
              ;
              bVar7 = (bool)((byte)(uVar27 >> 6) & 1);
              auVar61._24_4_ = (float)((uint)bVar7 * auVar47._24_4_ | (uint)!bVar7 * auVar50._24_4_)
              ;
              bVar7 = SUB81(uVar27 >> 7,0);
              auVar61._28_4_ = (uint)bVar7 * auVar47._28_4_ | (uint)!bVar7 * auVar50._28_4_;
              bVar7 = (bool)((byte)uVar20 & 1);
              fVar32 = (float)((uint)bVar7 * auVar45._0_4_ | (uint)!bVar7 * auVar48._0_4_);
              bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
              fVar64 = (float)((uint)bVar7 * auVar45._4_4_ | (uint)!bVar7 * auVar48._4_4_);
              bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
              fVar65 = (float)((uint)bVar7 * auVar45._8_4_ | (uint)!bVar7 * auVar48._8_4_);
              bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
              fVar66 = (float)((uint)bVar7 * auVar45._12_4_ | (uint)!bVar7 * auVar48._12_4_);
              bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
              fVar67 = (float)((uint)bVar7 * auVar45._16_4_ | (uint)!bVar7 * auVar48._16_4_);
              bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
              fVar68 = (float)((uint)bVar7 * auVar45._20_4_ | (uint)!bVar7 * auVar48._20_4_);
              bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
              fVar69 = (float)((uint)bVar7 * auVar45._24_4_ | (uint)!bVar7 * auVar48._24_4_);
              bVar7 = SUB81(uVar20 >> 7,0);
              auVar14._4_4_ = fVar95 * fVar64;
              auVar14._0_4_ = fVar95 * fVar32;
              auVar14._8_4_ = fVar95 * fVar65;
              auVar14._12_4_ = fVar95 * fVar66;
              auVar14._16_4_ = fVar95 * fVar67;
              auVar14._20_4_ = fVar95 * fVar68;
              auVar14._24_4_ = fVar95 * fVar69;
              auVar14._28_4_ = fVar95;
              auVar33 = vfmadd213ps_fma(auVar96,auVar61,auVar14);
              auVar33 = vfmadd213ps_fma(auVar92,auVar60,ZEXT1632(auVar33));
              auVar58 = ZEXT1632(CONCAT412(auVar33._12_4_ + auVar33._12_4_,
                                           CONCAT48(auVar33._8_4_ + auVar33._8_4_,
                                                    CONCAT44(auVar33._4_4_ + auVar33._4_4_,
                                                             auVar33._0_4_ + auVar33._0_4_))));
              auVar97._0_4_ = auVar40._0_4_ * fVar32;
              auVar97._4_4_ = auVar40._4_4_ * fVar64;
              auVar97._8_4_ = auVar40._8_4_ * fVar65;
              auVar97._12_4_ = auVar40._12_4_ * fVar66;
              auVar97._16_4_ = auVar40._16_4_ * fVar67;
              auVar97._20_4_ = auVar40._20_4_ * fVar68;
              auVar97._24_4_ = auVar40._24_4_ * fVar69;
              auVar97._28_4_ = 0;
              auVar33 = vfmadd213ps_fma(auVar62,auVar61,auVar97);
              auVar38 = vfmadd213ps_fma(auVar63,auVar60,ZEXT1632(auVar33));
              auVar62 = vrcp14ps_avx512vl(auVar58);
              auVar63._8_4_ = 0x3f800000;
              auVar63._0_8_ = 0x3f8000003f800000;
              auVar63._12_4_ = 0x3f800000;
              auVar63._16_4_ = 0x3f800000;
              auVar63._20_4_ = 0x3f800000;
              auVar63._24_4_ = 0x3f800000;
              auVar63._28_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_avx512vl(auVar62,auVar58,auVar63);
              auVar33 = vfmadd132ps_fma(auVar63,auVar62,auVar62);
              local_880 = ZEXT1632(CONCAT412(auVar33._12_4_ * (auVar38._12_4_ + auVar38._12_4_),
                                             CONCAT48(auVar33._8_4_ *
                                                      (auVar38._8_4_ + auVar38._8_4_),
                                                      CONCAT44(auVar33._4_4_ *
                                                               (auVar38._4_4_ + auVar38._4_4_),
                                                               auVar33._0_4_ *
                                                               (auVar38._0_4_ + auVar38._0_4_)))));
              uVar80 = *(undefined4 *)((long)&(local_b10->org).field_0 + 0xc);
              auVar62._4_4_ = uVar80;
              auVar62._0_4_ = uVar80;
              auVar62._8_4_ = uVar80;
              auVar62._12_4_ = uVar80;
              auVar62._16_4_ = uVar80;
              auVar62._20_4_ = uVar80;
              auVar62._24_4_ = uVar80;
              auVar62._28_4_ = uVar80;
              uVar9 = vcmpps_avx512vl(local_880,auVar62,0xd);
              auVar56._8_4_ = 0x80000000;
              auVar56._0_8_ = 0x8000000080000000;
              auVar56._12_4_ = 0x80000000;
              auVar56._16_4_ = 0x80000000;
              auVar56._20_4_ = 0x80000000;
              auVar56._24_4_ = 0x80000000;
              auVar56._28_4_ = 0x80000000;
              auVar63 = vxorps_avx512vl(auVar58,auVar56);
              fVar95 = local_b10->tfar;
              auVar12._4_4_ = fVar95;
              auVar12._0_4_ = fVar95;
              auVar12._8_4_ = fVar95;
              auVar12._12_4_ = fVar95;
              auVar12._16_4_ = fVar95;
              auVar12._20_4_ = fVar95;
              auVar12._24_4_ = fVar95;
              auVar12._28_4_ = fVar95;
              uVar11 = vcmpps_avx512vl(local_880,auVar12,2);
              uVar10 = vcmpps_avx512vl(auVar58,auVar63,4);
              local_8d8 = (byte)uVar9 & (byte)uVar11 & (byte)uVar10 & local_8d8;
              if (local_8d8 != 0) {
                local_a00._0_4_ = local_b10->tfar;
                local_a00._4_4_ = local_b10->mask;
                local_a00._8_4_ = local_b10->id;
                local_a00._12_4_ = local_b10->flags;
                uVar21 = vextractps_avx(local_a00,1);
                local_8e0 = &local_b21;
                auVar63 = vsubps_avx(local_900,auVar54);
                local_940 = vblendps_avx(auVar39,auVar63,0xf0);
                auVar63 = vsubps_avx(local_900,auVar39);
                local_920 = vblendps_avx(auVar54,auVar63,0xf0);
                local_860[0] = auVar60._0_4_ * 1.0;
                local_860[1] = auVar60._4_4_ * 1.0;
                local_860[2] = auVar60._8_4_ * 1.0;
                local_860[3] = auVar60._12_4_ * 1.0;
                fStack_850 = auVar60._16_4_ * -1.0;
                fStack_84c = auVar60._20_4_ * -1.0;
                fStack_848 = auVar60._24_4_ * -1.0;
                uStack_844 = auVar60._28_4_;
                local_840._4_4_ = auVar61._4_4_ * 1.0;
                local_840._0_4_ = auVar61._0_4_ * 1.0;
                local_840._8_4_ = auVar61._8_4_ * 1.0;
                local_840._12_4_ = auVar61._12_4_ * 1.0;
                local_840._16_4_ = auVar61._16_4_ * -1.0;
                local_840._20_4_ = auVar61._20_4_ * -1.0;
                local_840._24_4_ = auVar61._24_4_ * -1.0;
                local_840._28_4_ = auVar61._28_4_;
                local_820._4_4_ = fVar64 * 1.0;
                local_820._0_4_ = fVar32 * 1.0;
                local_820._8_4_ = fVar65 * 1.0;
                local_820._12_4_ = fVar66 * 1.0;
                local_820._16_4_ = fVar67 * -1.0;
                local_820._20_4_ = fVar68 * -1.0;
                local_820._24_4_ = fVar69 * -1.0;
                local_820._28_4_ = (uint)bVar7 * auVar45._28_4_ | (uint)!bVar7 * auVar48._28_4_;
                local_ae8 = (context->scene->geometries).items[local_ad0].ptr;
                if ((local_ae8->mask & uVar21) != 0) {
                  local_b20 = local_ae0->args;
                  if ((local_b20->filter == (RTCFilterFunctionN)0x0) &&
                     (local_ae8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01bfc3f6:
                    local_b10->tfar = -INFINITY;
                    return;
                  }
                  auVar63 = vpbroadcastd_avx512vl();
                  auVar63 = vpaddd_avx2(auVar63,_DAT_01fb7740);
                  auVar62 = vpbroadcastd_avx512vl();
                  auVar62 = vpaddd_avx2(auVar62,_DAT_01fb7760);
                  auVar88._0_4_ = (float)(int)(*(ushort *)(lVar19 + 8 + lVar28) - 1);
                  auVar88._4_12_ = auVar40._4_12_;
                  auVar17._12_4_ = 0;
                  auVar17._0_12_ = ZEXT812(0);
                  auVar38 = vrcp14ss_avx512f(auVar17 << 0x20,ZEXT416((uint)auVar88._0_4_));
                  auVar33 = vfnmadd213ss_fma(auVar88,auVar38,SUB6416(ZEXT464(0x40000000),0));
                  auVar94._0_4_ = (float)(int)(*(ushort *)(lVar19 + 10 + lVar28) - 1);
                  auVar94._4_12_ = auVar39._4_12_;
                  fVar69 = auVar38._0_4_ * auVar33._0_4_;
                  auVar38 = vrcp14ss_avx512f(auVar17 << 0x20,ZEXT416((uint)auVar94._0_4_));
                  auVar33 = vfnmadd213ss_fma(auVar94,auVar38,SUB6416(ZEXT464(0x40000000),0));
                  fVar8 = auVar33._0_4_ * auVar38._0_4_;
                  auVar63 = vcvtdq2ps_avx(auVar63);
                  auVar62 = vcvtdq2ps_avx(auVar62);
                  auVar13._8_4_ = 0x219392ef;
                  auVar13._0_8_ = 0x219392ef219392ef;
                  auVar13._12_4_ = 0x219392ef;
                  auVar13._16_4_ = 0x219392ef;
                  auVar13._20_4_ = 0x219392ef;
                  auVar13._24_4_ = 0x219392ef;
                  auVar13._28_4_ = 0x219392ef;
                  uVar24 = vcmpps_avx512vl(local_900,auVar13,5);
                  auVar58 = vrcp14ps_avx512vl(local_900);
                  auVar89._8_4_ = 0x3f800000;
                  auVar89._0_8_ = 0x3f8000003f800000;
                  auVar89._12_4_ = 0x3f800000;
                  auVar89._16_4_ = 0x3f800000;
                  auVar89._20_4_ = 0x3f800000;
                  auVar89._24_4_ = 0x3f800000;
                  auVar89._28_4_ = 0x3f800000;
                  auVar33 = vfnmadd213ps_fma(local_900,auVar58,auVar89);
                  auVar59 = vfmadd132ps_avx512vl(ZEXT1632(auVar33),auVar58,auVar58);
                  fVar68 = (float)((uint)((byte)uVar24 & 1) * auVar59._0_4_);
                  fVar67 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar59._4_4_);
                  fVar66 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar59._8_4_);
                  fVar65 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar59._12_4_);
                  fVar64 = (float)((uint)((byte)(uVar24 >> 4) & 1) * auVar59._16_4_);
                  fVar32 = (float)((uint)((byte)(uVar24 >> 5) & 1) * auVar59._20_4_);
                  fVar95 = (float)((uint)((byte)(uVar24 >> 6) & 1) * auVar59._24_4_);
                  auVar15._4_4_ =
                       (local_900._4_4_ * auVar63._4_4_ + local_940._4_4_) * fVar69 * fVar67;
                  auVar15._0_4_ =
                       (local_900._0_4_ * auVar63._0_4_ + local_940._0_4_) * fVar69 * fVar68;
                  auVar15._8_4_ =
                       (local_900._8_4_ * auVar63._8_4_ + local_940._8_4_) * fVar69 * fVar66;
                  auVar15._12_4_ =
                       (local_900._12_4_ * auVar63._12_4_ + local_940._12_4_) * fVar69 * fVar65;
                  auVar15._16_4_ =
                       (local_900._16_4_ * auVar63._16_4_ + local_940._16_4_) * fVar69 * fVar64;
                  auVar15._20_4_ =
                       (local_900._20_4_ * auVar63._20_4_ + local_940._20_4_) * fVar69 * fVar32;
                  auVar15._24_4_ =
                       (local_900._24_4_ * auVar63._24_4_ + local_940._24_4_) * fVar69 * fVar95;
                  auVar15._28_4_ = auVar58._28_4_;
                  local_8c0 = vminps_avx(auVar15,auVar89);
                  auVar16._4_4_ =
                       (local_900._4_4_ * auVar62._4_4_ + local_920._4_4_) * fVar8 * fVar67;
                  auVar16._0_4_ =
                       (local_900._0_4_ * auVar62._0_4_ + local_920._0_4_) * fVar8 * fVar68;
                  auVar16._8_4_ =
                       (local_900._8_4_ * auVar62._8_4_ + local_920._8_4_) * fVar8 * fVar66;
                  auVar16._12_4_ =
                       (local_900._12_4_ * auVar62._12_4_ + local_920._12_4_) * fVar8 * fVar65;
                  auVar16._16_4_ =
                       (local_900._16_4_ * auVar62._16_4_ + local_920._16_4_) * fVar8 * fVar64;
                  auVar16._20_4_ =
                       (local_900._20_4_ * auVar62._20_4_ + local_920._20_4_) * fVar8 * fVar32;
                  auVar16._24_4_ =
                       (local_900._24_4_ * auVar62._24_4_ + local_920._24_4_) * fVar8 * fVar95;
                  auVar16._28_4_ = (uint)(byte)(uVar24 >> 7) * auVar59._28_4_;
                  local_8a0 = vminps_avx(auVar16,auVar89);
                  local_b08 = 0;
                  local_b00 = (ulong)local_8d8;
                  for (uVar24 = local_b00; (uVar24 & 1) == 0;
                      uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                    local_b08 = local_b08 + 1;
                  }
                  local_b18 = local_ae0->user;
                  local_9a0 = auVar103._0_16_;
                  local_9b0 = auVar104._0_16_;
                  local_9c0 = auVar105._0_16_;
                  local_9d0 = auVar106._0_16_;
                  local_9e0 = auVar107._0_16_;
                  local_9f0 = auVar108._0_16_;
                  while (local_b00 != 0) {
                    local_a54 = *(undefined4 *)(local_8c0 + local_b08 * 4);
                    local_a50 = *(undefined4 *)(local_8a0 + local_b08 * 4);
                    local_b10->tfar = local_860[local_b08 - 8];
                    local_a60 = local_860[local_b08];
                    local_a5c = *(undefined4 *)(local_840 + local_b08 * 4);
                    local_a58 = *(undefined4 *)(local_820 + local_b08 * 4);
                    local_a4c = (undefined4)local_aa8;
                    local_a48 = (undefined4)local_ad0;
                    local_a44 = local_b18->instID[0];
                    local_a40 = local_b18->instPrimID[0];
                    local_aec = -1;
                    local_a30.valid = &local_aec;
                    local_a30.geometryUserPtr = local_ae8->userPtr;
                    local_a30.context = local_b18;
                    local_a30.ray = (RTCRayN *)local_b10;
                    local_a30.hit = (RTCHitN *)&local_a60;
                    local_a30.N = 1;
                    if (((local_ae8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_ae8->occlusionFilterN)(&local_a30), *local_a30.valid != 0)) &&
                       ((local_b20->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_b20->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_ae8->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_b20->filter)(&local_a30), *local_a30.valid != 0))))))
                    goto LAB_01bfc3f6;
                    local_b10->tfar = (float)local_a00._0_4_;
                    uVar24 = local_b08 & 0x3f;
                    local_b08 = 0;
                    local_b00 = local_b00 ^ 1L << uVar24;
                    for (uVar24 = local_b00; (uVar24 & 1) == 0;
                        uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                      local_b08 = local_b08 + 1;
                    }
                    auVar103 = ZEXT1664(local_9a0);
                    auVar104 = ZEXT1664(local_9b0);
                    auVar105 = ZEXT1664(local_9c0);
                    auVar106 = ZEXT1664(local_9d0);
                    auVar107 = ZEXT1664(local_9e0);
                    auVar108 = ZEXT1664(local_9f0);
                  }
                }
              }
            }
            auVar98 = ZEXT1664(local_960);
            auVar99 = ZEXT1664(local_970);
            auVar101 = ZEXT1664(local_980);
            auVar102 = ZEXT1664(local_990);
            context = local_ae0;
            puVar26 = local_ad8;
            uVar24 = local_ab0;
            uVar27 = local_ab8;
            fVar65 = local_950;
            fVar95 = fStack_94c;
            fVar32 = fStack_948;
            fVar64 = fStack_944;
            uVar20 = local_a68 - 1 & local_a68;
          }
        }
        goto LAB_01bfb885;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }